

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O0

Result __thiscall
presolve::HPresolve::presolveColSingletons(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  Result RVar1;
  size_type sVar2;
  reference pvVar3;
  reference pvVar4;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *this_00;
  iterator __last;
  long in_RDI;
  Result __result;
  HighsInt col;
  size_t i;
  HighsInt in_stack_000000ac;
  HighsPostsolveStack *in_stack_000000b0;
  HPresolve *in_stack_000000b8;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff78;
  anon_class_8_1_8991fb9c_for__M_pred in_stack_ffffffffffffff98;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> in_stack_ffffffffffffffa0;
  const_iterator in_stack_ffffffffffffffa8;
  size_type local_20;
  
  local_20 = 0;
  while( true ) {
    sVar2 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5b0));
    if (local_20 == sVar2) {
      this_00 = (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                (in_RDI + 0x5b0);
      std::vector<int,_std::allocator<int>_>::begin(in_stack_ffffffffffffff78);
      std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
      std::
      remove_if<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,presolve::HPresolve::presolveColSingletons(presolve::HighsPostsolveStack&)::__0>
                ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                 in_stack_ffffffffffffffa8._M_current,in_stack_ffffffffffffffa0,
                 in_stack_ffffffffffffff98);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                (this_00,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff78);
      __last = std::vector<int,_std::allocator<int>_>::end(in_stack_ffffffffffffff78);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                (this_00,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                         in_stack_ffffffffffffff78);
      std::vector<int,_std::allocator<int>_>::erase
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff98.this,
                 in_stack_ffffffffffffffa8,(const_iterator)__last._M_current);
      return kOk;
    }
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x5b0),local_20);
    pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 0x5e0),
                        (long)*pvVar3);
    if ((*pvVar4 == '\0') &&
       (RVar1 = colPresolve(in_stack_000000b8,in_stack_000000b0,in_stack_000000ac), RVar1 != kOk))
    break;
    local_20 = local_20 + 1;
  }
  return RVar1;
}

Assistant:

HPresolve::Result HPresolve::presolveColSingletons(
    HighsPostsolveStack& postsolve_stack) {
  for (size_t i = 0; i != singletonColumns.size(); ++i) {
    HighsInt col = singletonColumns[i];
    if (colDeleted[col]) continue;
    HPRESOLVE_CHECKED_CALL(colPresolve(postsolve_stack, col));
  }
  singletonColumns.erase(
      std::remove_if(
          singletonColumns.begin(), singletonColumns.end(),
          [&](HighsInt col) { return colDeleted[col] || colsize[col] > 1; }),
      singletonColumns.end());

  return Result::kOk;
}